

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSA.h
# Opt level: O2

int __thiscall
RSA::decrypt_abi_cxx11_
          (RSA *this,EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  long lVar1;
  long lVar2;
  Conversion *pCVar3;
  EVP_PKEY_CTX *pEVar4;
  iterator iVar5;
  RSA *__return_storage_ptr__;
  long lVar6;
  BigInt cipher;
  set<char,_std::less<char>,_std::allocator<char>_> vocab_set;
  allocator local_f9;
  RSA *local_f8;
  EVP_PKEY_CTX *local_f0;
  string *local_e8;
  BigInt local_e0;
  BigInt local_c0;
  BigInt local_a0;
  string local_80;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_60;
  
  local_f8 = this;
  std::set<char,std::less<char>,std::allocator<char>>::
  set<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((set<char,std::less<char>,std::allocator<char>> *)&local_60,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )*(char **)(ctx + 8),
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(*(char **)(ctx + 8) + *(long *)(ctx + 0x10)));
  local_e8 = (string *)(ctx + 0x48);
  lVar1 = *(long *)(ctx + 0x48);
  lVar2 = *(long *)(ctx + 0x50);
  lVar6 = 0;
  local_f0 = ctx;
  do {
    pEVar4 = local_f0;
    if (lVar2 == lVar6) {
      pCVar3 = *(Conversion **)(local_f0 + 0x1a0);
      std::__cxx11::string::string((string *)&local_80,local_e8);
      Conversion::convert_to_num_base(&local_e0,pCVar3,&local_80);
      __return_storage_ptr__ = local_f8;
      std::__cxx11::string::~string((string *)&local_80);
      pCVar3 = *(Conversion **)(pEVar4 + 0x1a0);
      BigInt::BigInt(&local_c0,(BigInt *)(pEVar4 + 0x140));
      BigInt::powMod(&local_a0,&local_e0,&local_c0,(BigInt *)(pEVar4 + 0xe0));
      Conversion::convert_to_voacb_base_abi_cxx11_
                ((string *)__return_storage_ptr__,pCVar3,&local_a0);
      std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_a0);
      std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_c0);
      std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_e0);
LAB_001036eb:
      std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
      ~_Rb_tree(&local_60);
      return (int)__return_storage_ptr__;
    }
    local_e0.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *(undefined1 *)(lVar1 + lVar6);
    iVar5 = std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
            ::find(&local_60,(key_type *)&local_e0);
    if ((_Rb_tree_header *)iVar5._M_node == &local_60._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::assign((char *)local_e8);
      BigInt::operator=((BigInt *)(local_f0 + 0x180),0);
      __return_storage_ptr__ = local_f8;
      std::__cxx11::string::string((string *)local_f8,"",&local_f9);
      goto LAB_001036eb;
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

string RSA::decrypt() {
    set<char> vocab_set(vocabulary.begin(), vocabulary.end());

    for (auto cipher_char:cipherText)
        if (vocab_set.find(cipher_char) == vocab_set.end()) {
            cipherText = "Some letter in the cipher text is not contained in vocabulary";
            cipher_BigInt = 0;
            return "";
        }
    BigInt cipher = conversion->convert_to_num_base(cipherText);

    return conversion->convert_to_voacb_base(cipher.powMod(d, n));
}